

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleMake
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,TupleMake *curr)

{
  bool bVar1;
  value_type *pvVar2;
  Iterator IVar3;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar4;
  undefined1 local_b0 [8];
  value_type arg;
  Iterator __end2;
  Iterator __begin2;
  Literals *__range2;
  undefined1 local_58 [8];
  Literals arguments;
  TupleMake *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *flow;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)curr;
  Literals::Literals((Literals *)local_58);
  generateArguments(__return_storage_ptr__,this,
                    (ExpressionList *)
                    &(arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage)->type,(Literals *)local_58);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (!bVar1) {
    IVar3 = SmallVector<wasm::Literal,_1UL>::begin((SmallVector<wasm::Literal,_1UL> *)local_58);
    __end2.
    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
    .index = (size_t)IVar3.
                     super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                     .parent;
    IVar4 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
             )SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)local_58);
    while( true ) {
      __end2.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .parent = (SmallVector<wasm::Literal,_1UL> *)IVar4.index;
      arg.type.id = (uintptr_t)IVar4.parent;
      bVar1 = SmallVector<wasm::Literal,_1UL>::
              IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                            *)&__end2.
                               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                               .index,(Iterator *)&arg.type);
      if (!bVar1) break;
      pvVar2 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                         ((Iterator *)
                          &__end2.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .index);
      ::wasm::Literal::Literal((Literal *)local_b0,pvVar2);
      bVar1 = Type::isConcrete((Type *)&arg.field_0.func.super_IString.str._M_str);
      if (!bVar1) {
        __assert_fail("arg.type.isConcrete()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x5c6,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleMake(TupleMake *) [SubType = wasm::ModuleRunner]"
                     );
      }
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,(Literal *)local_b0);
      ::wasm::Literal::~Literal((Literal *)local_b0);
      SmallVector<wasm::Literal,_1UL>::
      IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                    *)&__end2.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .index);
      IVar4.index = (size_t)__end2.
                            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                            .parent;
      IVar4.parent = (SmallVector<wasm::Literal,_1UL> *)arg.type.id;
    }
  }
  Literals::~Literals((Literals *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTupleMake(TupleMake* curr) {
    NOTE_ENTER("tuple.make");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    for (auto arg : arguments) {
      assert(arg.type.isConcrete());
      flow.values.push_back(arg);
    }
    return flow;
  }